

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

KOption getdetails(Header_conflict *h,size_t totalsize,char **fmt,int *psize,int *ntoalign)

{
  KOption KVar1;
  KOption KVar2;
  uint uVar3;
  uint uVar4;
  uint local_34;
  
  KVar1 = getoption(h,fmt,psize);
  local_34 = *psize;
  uVar4 = local_34;
  if (KVar1 == Kpaddalign) {
    if (**fmt != '\0') {
      KVar2 = getoption(h,fmt,(int *)&local_34);
      uVar4 = local_34;
      if (local_34 != 0 && KVar2 != Kchar) goto LAB_0013ecd2;
    }
    uVar4 = local_34;
    luaL_argerror(h->L,1,"invalid next option for option \'X\'");
  }
LAB_0013ecd2:
  uVar3 = 0;
  if (KVar1 != Kchar && 1 < (int)uVar4) {
    uVar3 = h->maxalign;
    if ((int)uVar4 < h->maxalign) {
      uVar3 = uVar4;
    }
    if ((uVar3 - 1 & uVar3) != 0) {
      luaL_argerror(h->L,1,"format asks for alignment not power of 2");
    }
    uVar3 = uVar3 - ((uint)totalsize & uVar3 - 1) & uVar3 - 1;
  }
  *ntoalign = uVar3;
  return KVar1;
}

Assistant:

static KOption getdetails (Header *h, size_t totalsize,
                           const char **fmt, int *psize, int *ntoalign) {
  KOption opt = getoption(h, fmt, psize);
  int align = *psize;  /* usually, alignment follows size */
  if (opt == Kpaddalign) {  /* 'X' gets alignment from following option */
    if (**fmt == '\0' || getoption(h, fmt, &align) == Kchar || align == 0)
      luaL_argerror(h->L, 1, "invalid next option for option 'X'");
  }
  if (align <= 1 || opt == Kchar)  /* need no alignment? */
    *ntoalign = 0;
  else {
    if (align > h->maxalign)  /* enforce maximum alignment */
      align = h->maxalign;
    if ((align & (align - 1)) != 0)  /* is 'align' not a power of 2? */
      luaL_argerror(h->L, 1, "format asks for alignment not power of 2");
    *ntoalign = (align - (int)(totalsize & (align - 1))) & (align - 1);
  }
  return opt;
}